

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess_p.h
# Opt level: O3

Key * __thiscall
QProcessEnvironmentPrivate::prepareName
          (Key *__return_storage_ptr__,QProcessEnvironmentPrivate *this,QString *name)

{
  QMutex *this_00;
  __pointer_type copy;
  Entry *pEVar1;
  Data<QHashPrivate::Node<QString,_QByteArray>_> *data;
  Data *pDVar2;
  uint uVar3;
  long lVar4;
  uchar *puVar5;
  ulong uVar6;
  uchar *puVar7;
  long in_FS_OFFSET;
  bool bVar8;
  TryEmplaceResult local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->nameMapMutex;
  if ((this->nameMapMutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
    LOCK();
    bVar8 = (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar8) {
      (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (bVar8) goto LAB_0041e7b4;
  }
  QBasicMutex::lockInternal(&this_00->super_QBasicMutex);
LAB_0041e7b4:
  QHash<QString,QByteArray>::tryEmplace_impl<QString_const&>
            (&local_50,(QHash<QString,QByteArray> *)&this->nameMap,name);
  pEVar1 = (local_50.iterator.i.d)->spans[local_50.iterator.i.bucket >> 7].entries;
  uVar3 = (uint)(local_50.iterator.i.d)->spans[local_50.iterator.i.bucket >> 7].offsets
                [(uint)local_50.iterator.i.bucket & 0x7f];
  uVar6 = (ulong)(uVar3 * 0x30);
  puVar5 = (pEVar1->storage).data + uVar6 + 0x18;
  lVar4 = *(long *)((pEVar1->storage).data + uVar6 + 0x28);
  if (lVar4 == 0) {
    QString::toLocal8Bit_helper((QByteArray *)&local_50,(QChar *)(name->d).ptr,(name->d).size);
    puVar7 = (pEVar1->storage).data + uVar6 + 0x28;
    data = *(Data<QHashPrivate::Node<QString,_QByteArray>_> **)puVar5;
    *(Data<QHashPrivate::Node<QString,_QByteArray>_> **)puVar5 = local_50.iterator.i.d;
    uVar6 = *(ulong *)((pEVar1->storage).data + (ulong)(uVar3 * 0x30) + 0x20);
    *(size_t *)((pEVar1->storage).data + (ulong)(uVar3 * 0x30) + 0x20) = local_50.iterator.i.bucket;
    lVar4 = *(long *)puVar7;
    puVar7[0] = local_50.inserted;
    puVar7[1] = local_50._17_1_;
    puVar7[2] = local_50._18_1_;
    puVar7[3] = local_50._19_1_;
    puVar7[4] = local_50._20_1_;
    puVar7[5] = local_50._21_1_;
    puVar7[6] = local_50._22_1_;
    puVar7[7] = local_50._23_1_;
    local_50.iterator.i.d = data;
    local_50.iterator.i.bucket = uVar6;
    local_50._16_8_ = lVar4;
    if (data != (Data<QHashPrivate::Node<QString,_QByteArray>_> *)0x0) {
      LOCK();
      (data->ref).atomic._q_value.super___atomic_base<int>._M_i =
           (data->ref).atomic._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->ref).atomic._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)data,1,0x10);
      }
    }
    lVar4 = *(long *)puVar7;
  }
  pDVar2 = *(Data **)puVar5;
  (__return_storage_ptr__->d).d = pDVar2;
  (__return_storage_ptr__->d).ptr =
       *(char **)((pEVar1->storage).data + (ulong)(uVar3 * 0x30) + 0x20);
  (__return_storage_ptr__->d).size = lVar4;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  LOCK();
  copy = (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p;
  (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  if (copy != (__pointer_type)0x1) {
    QBasicMutex::unlockInternalFutex(&this_00->super_QBasicMutex,copy);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

inline Key prepareName(const QString &name) const
    {
        const NameMapMutexLocker locker(this);
        Key &ent = nameMap[name];
        if (ent.isEmpty())
            ent = name.toLocal8Bit();
        return ent;
    }